

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O1

PClass * __thiscall AMinotaur::StaticType(AMinotaur *this)

{
  return RegistrationInfo.MyClass;
}

Assistant:

void AMinotaur::Tick ()
{
	Super::Tick ();
	
	// The unfriendly Minotaur (Heretic's) is invulnerable while charging
	if (!(flags5 & MF5_SUMMONEDMONSTER))
	{
		// Get MF_SKULLFLY bit and shift it so it matches MF2_INVULNERABLE
		DWORD flying = (flags & MF_SKULLFLY) << 3;
		if ((flags2 & MF2_INVULNERABLE) != flying)
		{
			flags2 ^= MF2_INVULNERABLE;
		}
	}
}